

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O2

void __thiscall cab_session::cab_session(cab_session *this,application *application,socket *socket)

{
  socket *this_00;
  ostream *poVar1;
  data_union local_9c;
  address local_80;
  string local_60;
  endpoint_type local_3c;
  
  (this->super_enable_shared_from_this<cab_session>)._M_weak_this.
  super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<cab_session>)._M_weak_this.
  super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_application = application;
  this_00 = &this->_socket;
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket(&this_00->
                  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 ,&socket->
                   super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                );
  (this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._M_dataplus._M_p = (pointer)handle_join;
  local_60._M_string_length = 0;
  local_60.field_2._M_allocated_capacity = (size_type)this;
  std::function<void()>::function<std::_Bind<void(cab_session::*(cab_session*))()>,void>
            ((function<void()> *)&this->_handle_buffer,
             (_Bind<void_(cab_session::*(cab_session_*))()> *)&local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,"Cab connection from ");
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint((endpoint_type *)&local_9c.base,
                    &this_00->
                     super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   );
  if (local_9c.base.sa_family != 2) {
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_9c.base.sa_data[6];
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_9c.base.sa_data[7];
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_9c.base.sa_data[8];
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_9c.base.sa_data[9];
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_9c.base.sa_data[10];
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_9c.base.sa_data[0xb];
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_9c.base.sa_data[0xc];
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_9c.base.sa_data[0xd];
    local_80.ipv6_address_.addr_.__in6_u._8_8_ = local_9c._16_8_;
    local_80.ipv6_address_.scope_id_ = (unsigned_long)local_9c.v6.sin6_scope_id;
    local_9c.v6.sin6_flowinfo = 0;
  }
  else {
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
    local_80.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
    local_80.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_80.ipv6_address_.scope_id_ = 0;
  }
  local_80.type_ = (anon_enum_32)(local_9c.base.sa_family != 2);
  local_80.ipv4_address_.addr_.s_addr = local_9c.v4.sin_addr.s_addr;
  boost::asio::ip::address::to_string_abi_cxx11_(&local_60,&local_80);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  poVar1 = std::operator<<(poVar1,":");
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint(&local_3c,
                    &this_00->
                     super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   );
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,local_3c.impl_.data_.v4.sin_port << 8 |
                             local_3c.impl_.data_.v4.sin_port >> 8);
  std::operator<<(poVar1," opened\n");
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

cab_session::cab_session(application& application, boost::asio::ip::tcp::socket&& socket):
    _application(&application),
    _socket(std::move(socket))
{
    std::cout << "Cab connection from " << this->_socket.remote_endpoint().address().to_string()
              << ":" << this->_socket.remote_endpoint().port() << " opened\n";
}